

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O1

btBroadphasePair * __thiscall
btHashedOverlappingPairCache::findPair
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  btBroadphasePair *pbVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  btBroadphasePair *pbVar5;
  btBroadphaseProxy *pbVar6;
  
  gFindPairs = gFindPairs + 1;
  pbVar6 = proxy1;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    pbVar6 = proxy0;
    proxy0 = proxy1;
  }
  uVar2 = pbVar6->m_uniqueId << 0x10 | proxy0->m_uniqueId;
  uVar2 = ~(uVar2 << 0xf) + uVar2;
  uVar2 = ((int)uVar2 >> 10 ^ uVar2) * 9;
  uVar2 = (int)uVar2 >> 6 ^ uVar2;
  uVar2 = ~(uVar2 << 0xb) + uVar2;
  uVar4 = (long)(int)((int)uVar2 >> 0x10 ^ uVar2) &
          (long)(this->m_overlappingPairArray).m_capacity - 1U;
  if (((int)uVar4 < (this->m_hashTable).m_size) &&
     (iVar3 = (this->m_hashTable).m_data[uVar4], iVar3 != -1)) {
    pbVar1 = (this->m_overlappingPairArray).m_data;
    do {
      if (((pbVar1[iVar3].m_pProxy0)->m_uniqueId == proxy0->m_uniqueId) &&
         (pbVar5 = pbVar1 + iVar3, pbVar5->m_pProxy1->m_uniqueId == pbVar6->m_uniqueId)) {
        return pbVar5;
      }
      iVar3 = (this->m_next).m_data[iVar3];
    } while (iVar3 != -1);
  }
  return (btBroadphasePair *)0x0;
}

Assistant:

btBroadphasePair* btHashedOverlappingPairCache::findPair(btBroadphaseProxy* proxy0, btBroadphaseProxy* proxy1)
{
	gFindPairs++;
	if(proxy0->m_uniqueId>proxy1->m_uniqueId) 
		btSwap(proxy0,proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		btSwap(proxyId1, proxyId2);*/

	int hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1), static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));

	if (hash >= m_hashTable.size())
	{
		return NULL;
	}

	int index = m_hashTable[hash];
	while (index != BT_NULL_PAIR && equalsPair(m_overlappingPairArray[index], proxyId1, proxyId2) == false)
	{
		index = m_next[index];
	}

	if (index == BT_NULL_PAIR)
	{
		return NULL;
	}

	btAssert(index < m_overlappingPairArray.size());

	return &m_overlappingPairArray[index];
}